

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHeader.cpp
# Opt level: O3

void __thiscall Test<Imf_3_4::Header>::testSubscript(Test<Imf_3_4::Header> *this,string *name)

{
  long lVar1;
  long lVar2;
  Header header;
  undefined8 local_50;
  Header local_48 [56];
  
  local_50 = 0;
  Imf_3_4::Header::Header(local_48,0x40,0x40,1.0,(Vec2 *)&local_50,1.0,INCREASING_Y,ZIP_COMPRESSION)
  ;
  lVar1 = Imf_3_4::Header::find((char *)local_48);
  lVar1 = *(long *)(lVar1 + 0x120);
  lVar2 = Imf_3_4::Header::operator[]((string *)local_48);
  if (lVar2 == lVar1) {
    Imf_3_4::Header::~Header(local_48);
    return;
  }
  __assert_fail("&attribute == &comparand",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHeader.cpp"
                ,0x26,
                "void Test<Imf_3_4::Header>::testSubscript(const string &) [Header = Imf_3_4::Header]"
               );
}

Assistant:

void testSubscript (const string& name)
    {
        Header header;
        auto&  comparand = header.find ("displayWindow").attribute ();
        auto&  attribute = header[name];
        assert (&attribute == &comparand);
    }